

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImproveCacheLocality.cpp
# Opt level: O2

ai_real __thiscall
Assimp::ImproveCacheLocalityProcess::ProcessMesh
          (ImproveCacheLocalityProcess *this,aiMesh *pMesh,uint meshNum)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  void *__s;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  Logger *pLVar7;
  aiFace *paVar8;
  uint uVar9;
  uint *piCur;
  ulong uVar10;
  uint *puVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  aiFace *paVar17;
  uint uVar18;
  uint *puVar19;
  uint uVar20;
  ai_real aVar21;
  float fVar22;
  reference rVar23;
  float local_2b8;
  uint local_2b4;
  uint local_294;
  uint *local_270;
  stack<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> sDeadEndVStack;
  VertexTriangleAdjacency adj;
  vector<unsigned_int,_std::allocator<unsigned_int>_> piNumTriPtrNoModify;
  char *local_1f0 [4];
  vector<bool,_std::allocator<bool>_> abEmitted;
  char szBuff [128];
  
  if (pMesh == (aiMesh *)0x0) {
    __assert_fail("nullptr != pMesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ImproveCacheLocality.cpp"
                  ,0x7a,
                  "ai_real Assimp::ImproveCacheLocalityProcess::ProcessMesh(aiMesh *, unsigned int)"
                 );
  }
  if (pMesh->mNumFaces == 0 || pMesh->mFaces == (aiFace *)0x0) {
    return 0.0;
  }
  if (pMesh->mNumVertices == 0 || pMesh->mVertices == (aiVector3D *)0x0) {
    return 0.0;
  }
  if (pMesh->mPrimitiveTypes == 4) {
    if (pMesh->mNumVertices <= this->mConfigCacheDepth) {
      return 0.0;
    }
    paVar17 = pMesh->mFaces + pMesh->mNumFaces;
    bVar2 = DefaultLogger::isNullLogger();
    if (bVar2) {
      uVar20 = pMesh->mNumFaces;
      local_2b8 = 3.0;
    }
    else {
      uVar20 = this->mConfigCacheDepth;
      uVar13 = (ulong)uVar20 * 4;
      puVar4 = (uint *)operator_new__(uVar13);
      memset(puVar4,0xff,uVar13);
      uVar18 = 0;
      puVar11 = puVar4;
      for (paVar8 = pMesh->mFaces; paVar8 != paVar17; paVar8 = paVar8 + 1) {
        for (lVar15 = 0; puVar5 = puVar4, lVar15 != 3; lVar15 = lVar15 + 1) {
          do {
            if (puVar4 + uVar20 <= puVar5) {
              uVar18 = uVar18 + 1;
              if (puVar4 + uVar20 == puVar11) {
                puVar11 = puVar4;
              }
              *puVar11 = paVar8->mIndices[lVar15];
              puVar11 = puVar11 + 1;
              break;
            }
            uVar9 = *puVar5;
            puVar5 = puVar5 + 1;
          } while (uVar9 != paVar8->mIndices[lVar15]);
        }
      }
      operator_delete__(puVar4);
      uVar20 = pMesh->mNumFaces;
      local_2b8 = (float)uVar18 / (float)uVar20;
      if ((local_2b8 == 3.0) && (!NAN(local_2b8))) {
        snprintf(szBuff,0x80,"Mesh %u: Not suitable for vcache optimization",(ulong)meshNum);
        pLVar7 = DefaultLogger::get();
        Logger::warn(pLVar7,szBuff);
        goto LAB_003b6b40;
      }
    }
    local_2b4 = 1;
    VertexTriangleAdjacency::VertexTriangleAdjacency
              (&adj,pMesh->mFaces,uVar20,pMesh->mNumVertices,true);
    uVar13 = (ulong)pMesh->mNumVertices << 2;
    __s = operator_new__(uVar13);
    memset(__s,0,uVar13);
    uVar20 = pMesh->mNumFaces;
    puVar4 = (uint *)operator_new__((ulong)(uVar20 * 3) << 2);
    szBuff._0_4_ = szBuff._0_4_ & 0xffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&abEmitted,(ulong)uVar20,(bool *)szBuff,(allocator_type *)local_1f0);
    puVar11 = adj.mLiveTriangles;
    sDeadEndVStack.c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sDeadEndVStack.c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sDeadEndVStack.c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&piNumTriPtrNoModify,
               adj.mLiveTriangles,adj.mLiveTriangles + pMesh->mNumVertices,(allocator_type *)szBuff)
    ;
    uVar20 = 0;
    for (lVar15 = 0; (ulong)pMesh->mNumVertices << 2 != lVar15; lVar15 = lVar15 + 4) {
      if (uVar20 <= *(uint *)((long)adj.mLiveTriangles + lVar15)) {
        uVar20 = *(uint *)((long)adj.mLiveTriangles + lVar15);
      }
    }
    if (uVar20 == 0) {
      __assert_fail("iMaxRefTris > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ImproveCacheLocality.cpp"
                    ,0xda,
                    "ai_real Assimp::ImproveCacheLocalityProcess::ProcessMesh(aiMesh *, unsigned int)"
                   );
    }
    puVar5 = (uint *)operator_new__((ulong)(uVar20 * 3) << 2);
    iVar14 = this->mConfigCacheDepth + 1;
    local_294 = 0;
    uVar13 = 0;
    local_270 = puVar4;
LAB_003b6d32:
    uVar20 = (uint)uVar13;
    if (-1 < (int)uVar20) {
      uVar18 = piNumTriPtrNoModify.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar13 & 0xffffffff];
      puVar6 = VertexTriangleAdjacency::GetAdjacentTriangles(&adj,uVar20);
      puVar19 = puVar5;
      for (uVar9 = 0; uVar9 != uVar18; uVar9 = uVar9 + 1) {
        uVar10 = (ulong)*puVar6;
        rVar23 = std::vector<bool,_std::allocator<bool>_>::operator[](&abEmitted,uVar10);
        if ((*rVar23._M_p & rVar23._M_mask) == 0) {
          paVar8 = pMesh->mFaces;
          uVar1 = paVar8[uVar10].mNumIndices;
          for (lVar15 = 0; (ulong)uVar1 << 2 != lVar15; lVar15 = lVar15 + 4) {
            szBuff._0_4_ = *(uint *)((long)paVar8[uVar10].mIndices + lVar15);
            uVar3 = uVar20;
            if (uVar20 != szBuff._0_4_) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&sDeadEndVStack.c,(value_type_conflict1 *)szBuff);
              *puVar19 = szBuff._0_4_;
              puVar19 = puVar19 + 1;
              puVar11[(uint)szBuff._0_4_] = puVar11[(uint)szBuff._0_4_] - 1;
              uVar3 = szBuff._0_4_;
            }
            *(uint *)((long)local_270 + lVar15) = uVar3;
            if (this->mConfigCacheDepth <
                (uint)(iVar14 - *(int *)((long)__s + (ulong)(uint)szBuff._0_4_ * 4))) {
              *(int *)((long)__s + (ulong)(uint)szBuff._0_4_ * 4) = iVar14;
              iVar14 = iVar14 + 1;
              local_294 = local_294 + 1;
            }
          }
          rVar23 = std::vector<bool,_std::allocator<bool>_>::operator[](&abEmitted,uVar10);
          local_270 = (uint *)((long)local_270 + lVar15);
          *rVar23._M_p = *rVar23._M_p | rVar23._M_mask;
        }
        puVar6 = puVar6 + 1;
      }
      puVar11[uVar13 & 0xffffffff] = 0;
      iVar12 = -1;
      uVar13 = 0xffffffff;
      for (puVar6 = puVar5; puVar6 != puVar19; puVar6 = puVar6 + 1) {
        uVar20 = *puVar6;
        if (puVar11[uVar20] != 0) {
          iVar16 = iVar14 - *(int *)((long)__s + (ulong)uVar20 * 4);
          if (this->mConfigCacheDepth < iVar16 + puVar11[uVar20] * 2) {
            iVar16 = 0;
          }
          if (iVar12 < iVar16) {
            uVar13 = (ulong)uVar20;
            iVar12 = iVar16;
          }
        }
      }
      if ((int)uVar13 == -1) {
        do {
          puVar19 = sDeadEndVStack.c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1;
          if (sDeadEndVStack.c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              sDeadEndVStack.c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start) goto LAB_003b6f19;
          uVar13 = (ulong)*puVar19;
          sDeadEndVStack.c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar19;
        } while (puVar11[uVar13] == 0);
        if (*puVar19 == 0xffffffff) {
LAB_003b6f19:
          uVar20 = pMesh->mNumVertices;
          uVar10 = (ulong)(int)local_2b4;
          uVar18 = uVar20;
          if ((int)uVar20 < (int)local_2b4) {
            uVar18 = local_2b4;
          }
          do {
            local_2b4 = uVar18;
            if ((long)(int)uVar20 <= (long)uVar10) {
              uVar13 = 0xffffffff;
              goto LAB_003b6d32;
            }
            uVar13 = uVar10 + 1;
            lVar15 = uVar10 + 1;
            uVar10 = uVar13;
            uVar18 = local_2b4;
          } while (puVar11[lVar15] == 0);
          local_2b4 = (uint)uVar13;
        }
      }
      goto LAB_003b6d32;
    }
    bVar2 = DefaultLogger::isNullLogger();
    aVar21 = 0.0;
    if (!bVar2) {
      uVar20 = pMesh->mNumFaces;
      pLVar7 = DefaultLogger::get();
      fVar22 = (float)local_294 / (float)uVar20;
      if (pLVar7->m_Severity == VERBOSE) {
        pLVar7 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[20]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)szBuff,
                   (char (*) [20])"Mesh %u | ACMR in: ");
        std::ostream::_M_insert<unsigned_long>((ulong)szBuff);
        std::operator<<((ostream *)szBuff," out: ");
        std::ostream::operator<<(szBuff,local_2b8);
        std::operator<<((ostream *)szBuff," | ~");
        std::ostream::operator<<(szBuff,fVar22);
        std::ostream::operator<<(szBuff,((local_2b8 - fVar22) / local_2b8) * 100.0);
        std::__cxx11::stringbuf::str();
        Logger::debug(pLVar7,local_1f0[0]);
        std::__cxx11::string::~string((string *)local_1f0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)szBuff);
      }
      aVar21 = fVar22 * (float)pMesh->mNumFaces;
    }
    puVar11 = puVar4;
    for (paVar8 = pMesh->mFaces; paVar8 != paVar17; paVar8 = paVar8 + 1) {
      uVar20 = paVar8->mNumIndices;
      if (uVar20 != 0) {
        puVar19 = paVar8->mIndices;
        *puVar19 = *puVar11;
        if (uVar20 == 1) {
          puVar11 = puVar11 + 1;
        }
        else {
          puVar19[1] = puVar11[1];
          if (uVar20 < 3) {
            puVar11 = puVar11 + 2;
          }
          else {
            puVar6 = puVar11 + 2;
            puVar11 = puVar11 + 3;
            puVar19[2] = *puVar6;
          }
        }
      }
    }
    operator_delete__(__s);
    operator_delete__(puVar4);
    operator_delete__(puVar5);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&piNumTriPtrNoModify.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
    ;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&sDeadEndVStack);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&abEmitted.super__Bvector_base<std::allocator<bool>_>);
    VertexTriangleAdjacency::~VertexTriangleAdjacency(&adj);
  }
  else {
    pLVar7 = DefaultLogger::get();
    Logger::error(pLVar7,"This algorithm works on triangle meshes only");
LAB_003b6b40:
    aVar21 = 0.0;
  }
  return aVar21;
}

Assistant:

ai_real ImproveCacheLocalityProcess::ProcessMesh( aiMesh* pMesh, unsigned int meshNum) {
    // TODO: rewrite this to use std::vector or boost::shared_array
    ai_assert(nullptr != pMesh);

    // Check whether the input data is valid
    // - there must be vertices and faces
    // - all faces must be triangulated or we can't operate on them
    if (!pMesh->HasFaces() || !pMesh->HasPositions())
        return static_cast<ai_real>(0.f);

    if (pMesh->mPrimitiveTypes != aiPrimitiveType_TRIANGLE) {
        ASSIMP_LOG_ERROR("This algorithm works on triangle meshes only");
        return static_cast<ai_real>(0.f);
    }

    if(pMesh->mNumVertices <= mConfigCacheDepth) {
        return static_cast<ai_real>(0.f);
    }

    ai_real fACMR = 3.f;
    const aiFace* const pcEnd = pMesh->mFaces+pMesh->mNumFaces;

    // Input ACMR is for logging purposes only
    if (!DefaultLogger::isNullLogger())     {

        unsigned int* piFIFOStack = new unsigned int[mConfigCacheDepth];
        memset(piFIFOStack,0xff,mConfigCacheDepth*sizeof(unsigned int));
        unsigned int* piCur = piFIFOStack;
        const unsigned int* const piCurEnd = piFIFOStack + mConfigCacheDepth;

        // count the number of cache misses
        unsigned int iCacheMisses = 0;
        for (const aiFace* pcFace = pMesh->mFaces;pcFace != pcEnd;++pcFace) {
            for (unsigned int qq = 0; qq < 3;++qq) {
                bool bInCache = false;
                for (unsigned int* pp = piFIFOStack;pp < piCurEnd;++pp) {
                    if (*pp == pcFace->mIndices[qq])    {
                        // the vertex is in cache
                        bInCache = true;
                        break;
                    }
                }
                if (!bInCache)  {
                    ++iCacheMisses;
                    if (piCurEnd == piCur) {
                        piCur = piFIFOStack;
                    }
                    *piCur++ = pcFace->mIndices[qq];
                }
            }
        }
        delete[] piFIFOStack;
        fACMR = (ai_real) iCacheMisses / pMesh->mNumFaces;
        if (3.0 == fACMR)   {
            char szBuff[128]; // should be sufficiently large in every case

            // the JoinIdenticalVertices process has not been executed on this
            // mesh, otherwise this value would normally be at least minimally
            // smaller than 3.0 ...
            ai_snprintf(szBuff,128,"Mesh %u: Not suitable for vcache optimization",meshNum);
            ASSIMP_LOG_WARN(szBuff);
            return static_cast<ai_real>(0.f);
        }
    }

    // first we need to build a vertex-triangle adjacency list
    VertexTriangleAdjacency adj(pMesh->mFaces,pMesh->mNumFaces, pMesh->mNumVertices,true);

    // build a list to store per-vertex caching time stamps
    unsigned int* const piCachingStamps = new unsigned int[pMesh->mNumVertices];
    memset(piCachingStamps,0x0,pMesh->mNumVertices*sizeof(unsigned int));

    // allocate an empty output index buffer. We store the output indices in one large array.
    // Since the number of triangles won't change the input faces can be reused. This is how
    // we save thousands of redundant mini allocations for aiFace::mIndices
    const unsigned int iIdxCnt = pMesh->mNumFaces*3;
    unsigned int* const piIBOutput = new unsigned int[iIdxCnt];
    unsigned int* piCSIter = piIBOutput;

    // allocate the flag array to hold the information
    // whether a face has already been emitted or not
    std::vector<bool> abEmitted(pMesh->mNumFaces,false);

    // dead-end vertex index stack
    std::stack<unsigned int, std::vector<unsigned int> > sDeadEndVStack;

    // create a copy of the piNumTriPtr buffer
    unsigned int* const piNumTriPtr = adj.mLiveTriangles;
    const std::vector<unsigned int> piNumTriPtrNoModify(piNumTriPtr, piNumTriPtr + pMesh->mNumVertices);

    // get the largest number of referenced triangles and allocate the "candidate buffer"
    unsigned int iMaxRefTris = 0; {
        const unsigned int* piCur = adj.mLiveTriangles;
        const unsigned int* const piCurEnd = adj.mLiveTriangles+pMesh->mNumVertices;
        for (;piCur != piCurEnd;++piCur) {
            iMaxRefTris = std::max(iMaxRefTris,*piCur);
        }
    }
    ai_assert(iMaxRefTris > 0);
    unsigned int* piCandidates = new unsigned int[iMaxRefTris*3];
    unsigned int iCacheMisses = 0;

    // ...................................................................................
    /** PSEUDOCODE for the algorithm

        A = Build-Adjacency(I) Vertex-triangle adjacency
        L = Get-Triangle-Counts(A) Per-vertex live triangle counts
        C = Zero(Vertex-Count(I)) Per-vertex caching time stamps
        D = Empty-Stack() Dead-end vertex stack
        E = False(Triangle-Count(I)) Per triangle emitted flag
        O = Empty-Index-Buffer() Empty output buffer
        f = 0 Arbitrary starting vertex
        s = k+1, i = 1 Time stamp and cursor
        while f >= 0 For all valid fanning vertices
            N = Empty-Set() 1-ring of next candidates
            for each Triangle t in Neighbors(A, f)
                if !Emitted(E,t)
                    for each Vertex v in t
                        Append(O,v) Output vertex
                        Push(D,v) Add to dead-end stack
                        Insert(N,v) Register as candidate
                        L[v] = L[v]-1 Decrease live triangle count
                        if s-C[v] > k If not in cache
                            C[v] = s Set time stamp
                            s = s+1 Increment time stamp
                    E[t] = true Flag triangle as emitted
            Select next fanning vertex
            f = Get-Next-Vertex(I,i,k,N,C,s,L,D)
        return O
        */
    // ...................................................................................

    int ivdx = 0;
    int ics = 1;
    int iStampCnt = mConfigCacheDepth+1;
    while (ivdx >= 0)   {

        unsigned int icnt = piNumTriPtrNoModify[ivdx];
        unsigned int* piList = adj.GetAdjacentTriangles(ivdx);
        unsigned int* piCurCandidate = piCandidates;

        // get all triangles in the neighborhood
        for (unsigned int tri = 0; tri < icnt;++tri)    {

            // if they have not yet been emitted, add them to the output IB
            const unsigned int fidx = *piList++;
            if (!abEmitted[fidx])   {

                // so iterate through all vertices of the current triangle
                const aiFace* pcFace = &pMesh->mFaces[ fidx ];
                unsigned nind = pcFace->mNumIndices;
                for (unsigned ind = 0; ind < nind; ind++) {
                    unsigned dp = pcFace->mIndices[ind];

                    // the current vertex won't have any free triangles after this step
                    if (ivdx != (int)dp) {
                        // append the vertex to the dead-end stack
                        sDeadEndVStack.push(dp);

                        // register as candidate for the next step
                        *piCurCandidate++ = dp;

                        // decrease the per-vertex triangle counts
                        piNumTriPtr[dp]--;
                    }

                    // append the vertex to the output index buffer
                    *piCSIter++ = dp;

                    // if the vertex is not yet in cache, set its cache count
                    if (iStampCnt-piCachingStamps[dp] > mConfigCacheDepth) {
                        piCachingStamps[dp] = iStampCnt++;
                        ++iCacheMisses;
                    }
                }
                // flag triangle as emitted
                abEmitted[fidx] = true;
            }
        }

        // the vertex has now no living adjacent triangles anymore
        piNumTriPtr[ivdx] = 0;

        // get next fanning vertex
        ivdx = -1;
        int max_priority = -1;
        for (unsigned int* piCur = piCandidates;piCur != piCurCandidate;++piCur)    {
            const unsigned int dp = *piCur;

            // must have live triangles
            if (piNumTriPtr[dp] > 0)    {
                int priority = 0;

                // will the vertex be in cache, even after fanning occurs?
                unsigned int tmp;
                if ((tmp = iStampCnt-piCachingStamps[dp]) + 2*piNumTriPtr[dp] <= mConfigCacheDepth) {
                    priority = tmp;
                }

                // keep best candidate
                if (priority > max_priority) {
                    max_priority = priority;
                    ivdx = dp;
                }
            }
        }
        // did we reach a dead end?
        if (-1 == ivdx) {
            // need to get a non-local vertex for which we have a good chance that it is still
            // in the cache ...
            while (!sDeadEndVStack.empty()) {
                unsigned int iCachedIdx = sDeadEndVStack.top();
                sDeadEndVStack.pop();
                if (piNumTriPtr[ iCachedIdx ] > 0)  {
                    ivdx = iCachedIdx;
                    break;
                }
            }

            if (-1 == ivdx) {
                // well, there isn't such a vertex. Simply get the next vertex in input order and
                // hope it is not too bad ...
                while (ics < (int)pMesh->mNumVertices)  {
                    ++ics;
                    if (piNumTriPtr[ics] > 0)   {
                        ivdx = ics;
                        break;
                    }
                }
            }
        }
    }
    ai_real fACMR2 = 0.0f;
    if (!DefaultLogger::isNullLogger()) {
        fACMR2 = (float)iCacheMisses / pMesh->mNumFaces;

        // very intense verbose logging ... prepare for much text if there are many meshes
        if ( DefaultLogger::get()->getLogSeverity() == Logger::VERBOSE) {
            ASSIMP_LOG_DEBUG_F("Mesh %u | ACMR in: ", meshNum, " out: ", fACMR, " | ~", fACMR2, ((fACMR - fACMR2) / fACMR) * 100.f);
        }

        fACMR2 *= pMesh->mNumFaces;
    }
    // sort the output index buffer back to the input array
    piCSIter = piIBOutput;
    for (aiFace* pcFace = pMesh->mFaces; pcFace != pcEnd;++pcFace)  {
        unsigned nind = pcFace->mNumIndices;
        unsigned * ind = pcFace->mIndices;
        if (nind > 0) ind[0] = *piCSIter++;
        if (nind > 1) ind[1] = *piCSIter++;
        if (nind > 2) ind[2] = *piCSIter++;
    }

    // delete temporary storage
    delete[] piCachingStamps;
    delete[] piIBOutput;
    delete[] piCandidates;

    return fACMR2;
}